

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O0

void mathCore::trans_var(expression *a,uint uuid)

{
  uint uuid_local;
  expression *a_local;
  
  clear_type_flag(a);
  a->FLAGS = a->FLAGS | 2;
  a->uuid = uuid;
  if ((uuid < 2) || (expression::global_uuid < uuid)) {
    __cxa_rethrow();
  }
  return;
}

Assistant:

void mathCore::trans_var(expression* a, unsigned int uuid) {
	mathCore::clear_type_flag(a);
	a->FLAGS |= F_VAR;
	a->uuid = uuid;

	// Invalid Variable, this never happens so it gets branch predicted over
	if (uuid < 2 || uuid > expression::global_uuid) {
		throw;
	}
}